

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O3

CP_DP_Interface LoadDummyDP(void)

{
  memset(&dummyDPInterface,0,0xc0);
  dummyDPInterface.ReaderContactFormats = DummyReaderContactStructs;
  dummyDPInterface.WriterContactFormats = DummyWriterContactStructs;
  dummyDPInterface.initReader = DummyInitReader;
  dummyDPInterface.initWriter = DummyInitWriter;
  dummyDPInterface.initWriterPerReader = DummyInitWriterPerReader;
  dummyDPInterface.provideWriterDataToReader = DummyProvideWriterDataToReader;
  dummyDPInterface.readRemoteMemory = DummyReadRemoteMemory;
  dummyDPInterface.waitForCompletion = DummyWaitForCompletion;
  dummyDPInterface.provideTimestep = DummyProvideTimestep;
  dummyDPInterface.releaseTimestep = DummyReleaseTimestep;
  return &dummyDPInterface;
}

Assistant:

extern CP_DP_Interface LoadDummyDP()
{
    memset(&dummyDPInterface, 0, sizeof(dummyDPInterface));
    dummyDPInterface.ReaderContactFormats =
        DummyReaderContactStructs; // description of reader contact info
    dummyDPInterface.WriterContactFormats =
        DummyWriterContactStructs; // description of writer contact info
    dummyDPInterface.TimestepInfoFormats =
        NULL; // DummyTimestepInfoStructs;   Per rank per timestep info
    dummyDPInterface.initReader = DummyInitReader;
    dummyDPInterface.initWriter = DummyInitWriter;
    dummyDPInterface.initWriterPerReader = DummyInitWriterPerReader;
    dummyDPInterface.provideWriterDataToReader = DummyProvideWriterDataToReader;
    dummyDPInterface.readRemoteMemory = (CP_DP_ReadRemoteMemoryFunc)DummyReadRemoteMemory;
    dummyDPInterface.waitForCompletion = DummyWaitForCompletion;
    dummyDPInterface.provideTimestep = (CP_DP_ProvideTimestepFunc)DummyProvideTimestep;
    dummyDPInterface.releaseTimestep = (CP_DP_ReleaseTimestepFunc)DummyReleaseTimestep;

    // See dp_interface.h for more routines in the interface, but the basic
    // necessities to get started are above. The remainder allow for locking
    // read/write patterns, cleaner failure semantics, resource cleanup on
    // shutdown, etc.

    return &dummyDPInterface;
}